

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O1

void __thiscall JumpBasic::analyzeGuards(JumpBasic *this,BlockBasic *bl,int4 pathout)

{
  pointer *ppGVar1;
  int iVar2;
  pointer pGVar3;
  pointer pBVar4;
  uint path;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  Varnode *v;
  long lVar7;
  BlockBasic *pBVar8;
  GuardRecord *pGVar9;
  iterator iVar10;
  ulong uVar11;
  bool bVar12;
  byte bVar13;
  Varnode *markup;
  CircleRange rng;
  Varnode *local_a8;
  ulong local_a0;
  CircleRange local_98;
  GuardRecord local_78;
  PcodeOp *op;
  
  bVar13 = 0;
  pGVar3 = (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar2 = ((this->super_JumpModel).jumptable)->recoverystage;
  if ((this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar3) {
    (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar3;
  }
  uVar11 = 0;
  do {
    pBVar8 = bl;
    if ((pathout < 0) ||
       (pBVar4 = (bl->super_FlowBlock).outofthis.
                 super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                 super__Vector_impl_data._M_start,
       (int)((ulong)((long)(bl->super_FlowBlock).outofthis.
                           super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pBVar4) >> 3) * -0x55555555 !=
       2)) {
      do {
        bl = pBVar8;
        pBVar4 = (bl->super_FlowBlock).intothis.
                 super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(bl->super_FlowBlock).intothis.
                                super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pBVar4) >> 3) *
            -0x55555555 != 1) {
          return;
        }
        pBVar8 = (BlockBasic *)pBVar4->point;
      } while ((int)((ulong)((long)(pBVar8->super_FlowBlock).outofthis.
                                   super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl
                                   .super__Vector_impl_data._M_finish -
                            (long)(pBVar8->super_FlowBlock).outofthis.
                                  super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3) * -0x55555555 == 1);
      pathout = pBVar4->reverse_index;
    }
    else {
      bl = (BlockBasic *)pBVar4[(uint)pathout].point;
    }
    iVar6 = (*(pBVar8->super_FlowBlock)._vptr_FlowBlock[0xe])(pBVar8);
    op = (PcodeOp *)CONCAT44(extraout_var,iVar6);
    if ((op == (PcodeOp *)0x0) || (op->opcode->opcode != CPUI_CBRANCH)) {
      bVar5 = false;
    }
    else {
      v = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
          super__Vector_impl_data._M_start[1];
      local_a0 = uVar11;
      CircleRange::CircleRange(&local_98,(bool)((byte)(op->flags >> 8) & 1 ^ pathout - 1U == 0));
      path = -(pathout - 1U);
      if (((pBVar8->super_FlowBlock).flags >> 0x10 & 1) == 0) {
        path = pathout;
      }
      GuardRecord::GuardRecord(&local_78,op,path,&local_98,v);
      iVar10._M_current =
           (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<GuardRecord,_std::allocator<GuardRecord>_>::_M_realloc_insert<GuardRecord>
                  (&this->selectguards,iVar10,&local_78);
      }
      else {
        pGVar9 = &local_78;
        for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
          (iVar10._M_current)->cbranch = pGVar9->cbranch;
          pGVar9 = (GuardRecord *)((long)pGVar9 + (ulong)bVar13 * -0x10 + 8);
          iVar10._M_current = iVar10._M_current + (ulong)bVar13 * -0x10 + 8;
        }
        ppGVar1 = &(this->selectguards).
                   super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppGVar1 = *ppGVar1 + 1;
      }
      iVar6 = 0;
      do {
        if ((v->flags & 0x10) == 0) {
LAB_00282c46:
          bVar5 = false;
        }
        else {
          v = CircleRange::pullBack(&local_98,v->def,&local_a8,iVar2 == 0);
          if (v == (Varnode *)0x0) {
            v = (Varnode *)0x0;
            goto LAB_00282c46;
          }
          if (local_98.isempty != false) goto LAB_00282c46;
          GuardRecord::GuardRecord(&local_78,op,path,&local_98,v);
          iVar10._M_current =
               (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar10._M_current ==
              (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<GuardRecord,_std::allocator<GuardRecord>_>::_M_realloc_insert<GuardRecord>
                      (&this->selectguards,iVar10,&local_78);
          }
          else {
            pGVar9 = &local_78;
            for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
              (iVar10._M_current)->cbranch = pGVar9->cbranch;
              pGVar9 = (GuardRecord *)((long)pGVar9 + (ulong)bVar13 * -0x10 + 8);
              iVar10._M_current = iVar10._M_current + (ulong)bVar13 * -0x10 + 8;
            }
            ppGVar1 = &(this->selectguards).
                       super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppGVar1 = *ppGVar1 + 1;
          }
          bVar5 = true;
        }
        bVar12 = iVar6 == 0;
        iVar6 = iVar6 + -1;
      } while ((bVar5) && (bVar12));
      bVar5 = true;
      bl = pBVar8;
      uVar11 = local_a0;
    }
    if (!bVar5) {
      return;
    }
    iVar6 = (int)uVar11;
    pathout = 0xffffffff;
    uVar11 = (ulong)(iVar6 + 1);
    if (iVar6 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void JumpBasic::analyzeGuards(BlockBasic *bl,int4 pathout)

{ // Analyze each CBRANCH leading up to -bl- switch.
  // (if pathout>=0, also analyze the CBRANCH in -bl- that chooses this path)
  // Analyze the range restrictions on the various variables which allow
  // control flow to pass through the CBRANCHs to the switch.
  // Make note of all these restrictions in the guard list
  // For later determination of the correct switch variable.
  int4 i,j,indpath;
  int4 maxbranch = 2;		// Maximum number of CBRANCHs to consider
  int4 maxpullback = 2;
  bool usenzmask = (jumptable->getStage() == 0);

  selectguards.clear();
  BlockBasic *prevbl;
  Varnode *vn;

  for(i=0;i<maxbranch;++i) {
    if ((pathout>=0)&&(bl->sizeOut()==2)) {
      prevbl = bl;
      bl = (BlockBasic *)prevbl->getOut(pathout);
      indpath = pathout;
      pathout = -1;
    }
    else {
      pathout = -1;		// Make sure not to use pathout next time around
      for(;;) {
	if (bl->sizeIn() != 1) return; // Assume only 1 path to switch
	prevbl = (BlockBasic *)bl->getIn(0);
	if (prevbl->sizeOut() != 1) break; // Is it possible to deviate from switch path in this block
	bl = prevbl;		// If not, back up to next block
      }
      indpath = bl->getInRevIndex(0);
    }
    PcodeOp *cbranch = prevbl->lastOp();
    if ((cbranch==(PcodeOp *)0)||(cbranch->code() != CPUI_CBRANCH))
      break;
    bool toswitchval = (indpath == 1);
    if (cbranch->isBooleanFlip())
      toswitchval = !toswitchval;
    bl = prevbl;
    vn = cbranch->getIn(1);
    CircleRange rng(toswitchval);
    
    // The boolean variable could conceivably be the switch variable
    int4 indpathstore = prevbl->getFlipPath() ? 1-indpath : indpath;
    selectguards.push_back(GuardRecord(cbranch,indpathstore,rng,vn));
    for(j=0;j<maxpullback;++j) {
      Varnode *markup;		// Throw away markup information
      if (!vn->isWritten()) break;
      vn = rng.pullBack(vn->getDef(),&markup,usenzmask);
      if (vn == (Varnode *)0) break;
      if (rng.isEmpty()) break;
      selectguards.push_back(GuardRecord(cbranch,indpathstore,rng,vn));
    }
  }
}